

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O0

void XXH128_digest(XXH128_state_t *state_in,void *out)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  XXH_endianess endian_detected;
  void *out_local;
  XXH128_state_t *state_in_local;
  U64 v4_1;
  U64 v3_1;
  U64 v2_1;
  U64 v1_1;
  U64 h2_1;
  U64 h1_1;
  BYTE *p_1;
  XXH_istate128_t *state_1;
  U64 v4;
  U64 v3;
  U64 v2;
  U64 v1;
  U64 h2;
  U64 h1;
  BYTE *p;
  XXH_istate128_t *state;
  
  if ((ulong)state_in->ll[0] < 0x20) {
    h2 = state_in->ll[1] + 0x27d4eb2f165667c5;
    v1 = state_in->ll[1] + 0x9e3779b185ebca87;
  }
  else {
    uVar1 = state_in->ll[2] * -0x6c158a5880000000 |
            (ulong)(state_in->ll[2] * -0x3d4d51c2d82b14b1) >> 0x21;
    uVar2 = uVar1 * -0x61c8864e7a143579;
    uVar3 = state_in->ll[3] * -0x3d4d51c2d82b14b1;
    uVar1 = (uVar3 << 0x21 | uVar3 >> 0x1f) * -0x61c8864e7a143579 ^
            ((uVar1 * -0x73d0a1abc8000000 | uVar2 >> 0x25) + uVar2) * -0x61c8864e7a143579 +
            0x85ebca77c2b2ae63;
    uVar1 = (state_in->ll[4] * -0x5b05629620000000 |
            (ulong)(state_in->ll[4] * -0x3d4d51c2d82b14b1) >> 0x23) * -0x61c8864e7a143579 ^
            ((uVar1 << 0x1b | uVar1 >> 0x25) + uVar1) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63 ^
            uVar2;
    v1 = (state_in->ll[5] * -0x16c158a588000000 |
         (ulong)(state_in->ll[5] * -0x3d4d51c2d82b14b1) >> 0x25) * -0x61c8864e7a143579 ^
         ((uVar1 << 0x1b | uVar1 >> 0x25) + uVar1) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63 ^
         uVar1;
    h2 = ((v1 << 0x1b | v1 >> 0x25) + v1) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63 ^ uVar1;
  }
  switch((uint)state_in->ll[0] & 0x1f) {
  case 0x1f:
    v1 = (ulong)*(byte *)((long)state_in->ll + 0x4e) << 0x30 ^ v1;
  case 0x1e:
    v1 = (ulong)*(byte *)((long)state_in->ll + 0x4d) << 0x28 ^ v1;
  case 0x1d:
    v1 = (ulong)*(byte *)((long)state_in->ll + 0x4c) << 0x20 ^ v1;
  case 0x1c:
    v1 = (ulong)*(byte *)((long)state_in->ll + 0x4b) << 0x18 ^ v1;
  case 0x1b:
    v1 = (ulong)*(byte *)((long)state_in->ll + 0x4a) << 0x10 ^ v1;
  case 0x1a:
    v1 = (ulong)*(byte *)((long)state_in->ll + 0x49) << 8 ^ v1;
  case 0x19:
    v1 = (byte)state_in->ll[9] ^ v1;
    h2 = (v1 * -0x6a8e16c158a58800 | v1 * -0x3d4d51c2d82b14b1 >> 0x35) * -0x61c8864e7a143579 ^ h2;
  case 0x18:
    h2 = (ulong)*(byte *)((long)state_in->ll + 0x47) << 0x38 ^ h2;
  case 0x17:
    h2 = (ulong)*(byte *)((long)state_in->ll + 0x46) << 0x30 ^ h2;
  case 0x16:
    h2 = (ulong)*(byte *)((long)state_in->ll + 0x45) << 0x28 ^ h2;
  case 0x15:
    h2 = (ulong)*(byte *)((long)state_in->ll + 0x44) << 0x20 ^ h2;
  case 0x14:
    h2 = (ulong)*(byte *)((long)state_in->ll + 0x43) << 0x18 ^ h2;
  case 0x13:
    h2 = (ulong)*(byte *)((long)state_in->ll + 0x42) << 0x10 ^ h2;
  case 0x12:
    h2 = (ulong)*(byte *)((long)state_in->ll + 0x41) << 8 ^ h2;
  case 0x11:
    h2 = (byte)state_in->ll[8] ^ h2;
    v1 = (h2 * -0x6a8e16c158a58800 | h2 * -0x3d4d51c2d82b14b1 >> 0x35) * -0x61c8864e7a143579 ^ v1;
  case 0x10:
    v1 = (ulong)*(byte *)((long)state_in->ll + 0x3f) << 0x38 ^ v1;
  case 0xf:
    v1 = (ulong)*(byte *)((long)state_in->ll + 0x3e) << 0x30 ^ v1;
  case 0xe:
    v1 = (ulong)*(byte *)((long)state_in->ll + 0x3d) << 0x28 ^ v1;
  case 0xd:
    v1 = (ulong)*(byte *)((long)state_in->ll + 0x3c) << 0x20 ^ v1;
  case 0xc:
    v1 = (ulong)*(byte *)((long)state_in->ll + 0x3b) << 0x18 ^ v1;
  case 0xb:
    v1 = (ulong)*(byte *)((long)state_in->ll + 0x3a) << 0x10 ^ v1;
  case 10:
    v1 = (ulong)*(byte *)((long)state_in->ll + 0x39) << 8 ^ v1;
  case 9:
    v1 = (byte)state_in->ll[7] ^ v1;
    h2 = (v1 * -0x6a8e16c158a58800 | v1 * -0x3d4d51c2d82b14b1 >> 0x35) * -0x61c8864e7a143579 ^ h2;
  case 8:
    h2 = (ulong)*(byte *)((long)state_in->ll + 0x37) << 0x38 ^ h2;
  case 7:
    h2 = (ulong)*(byte *)((long)state_in->ll + 0x36) << 0x30 ^ h2;
  case 6:
    h2 = (ulong)*(byte *)((long)state_in->ll + 0x35) << 0x28 ^ h2;
  case 5:
    h2 = (ulong)*(byte *)((long)state_in->ll + 0x34) << 0x20 ^ h2;
  case 4:
    h2 = (ulong)*(byte *)((long)state_in->ll + 0x33) << 0x18 ^ h2;
  case 3:
    h2 = (ulong)*(byte *)((long)state_in->ll + 0x32) << 0x10 ^ h2;
  case 2:
    h2 = (ulong)*(byte *)((long)state_in->ll + 0x31) << 8 ^ h2;
  case 1:
    uVar1 = (byte)state_in->ll[6] ^ h2;
    v1 = (uVar1 * -0x58a6874d4cc1d800 | uVar1 * 0x27d4eb2f165667c5 >> 0x35) * -0x61c8864e7a143579 ^
         v1;
  default:
    uVar1 = state_in->ll[0] + (v1 << 0x1b | v1 >> 0x25) * -0x61c8864e7a143579 + -0x7a1435883d4d519d;
    uVar2 = (uVar1 >> 0x21 ^ state_in->ll[0] + v1) * -0x3d4d51c2d82b14b1;
    uVar1 = (uVar2 >> 0x1d ^ uVar1) * 0x165667b19e3779f9;
    *(ulong *)out = uVar1;
    *(ulong *)((long)out + 8) = uVar1 >> 0x20 ^ uVar2;
    return;
  }
}

Assistant:

void XXH128_digest(const XXH128_state_t *state_in, void *out) {
    XXH_endianess endian_detected = (XXH_endianess) XXH_CPU_LITTLE_ENDIAN;

    if ((endian_detected == XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
        return XXH128_digest_endian(state_in, XXH_littleEndian, (unsigned long long *) out);
    else
        return XXH128_digest_endian(state_in, XXH_bigEndian, (unsigned long long *) out);
}